

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgmsg.cpp
# Opt level: O0

BOOL DBG_get_indent(DBG_LEVEL_ID level,char *format,char *indent_string)

{
  FILE *pFVar1;
  uint uVar2;
  char *pcVar3;
  void *local_30;
  INT_PTR nesting;
  int ret;
  char *indent_string_local;
  char *format_local;
  DBG_LEVEL_ID level_local;
  
  if ((level == DLI_ENTRY) || (level == DLI_EXIT)) {
    if (max_entry_level == 0) {
      *indent_string = '\0';
    }
    else {
      if (level == DLI_EXIT) {
        local_30 = pthread_getspecific(entry_level_key);
        if (local_30 != (void *)0x0) {
          local_30 = (void *)((long)local_30 + -1);
          uVar2 = pthread_setspecific(entry_level_key,local_30);
          pFVar1 = _stderr;
          if (uVar2 != 0) {
            pcVar3 = strerror(uVar2);
            fprintf(pFVar1,"ERROR : pthread_setspecific() failed error:%d (%s)\n",(ulong)uVar2,
                    pcVar3);
          }
        }
      }
      else {
        local_30 = pthread_getspecific(entry_level_key);
        uVar2 = pthread_setspecific(entry_level_key,(void *)((long)local_30 + 1));
        pFVar1 = _stderr;
        if (uVar2 != 0) {
          pcVar3 = strerror(uVar2);
          fprintf(pFVar1,"ERROR : pthread_setspecific() failed error:%d (%s)\n",(ulong)uVar2,pcVar3)
          ;
        }
      }
      if ((long)max_entry_level <= (long)local_30) {
        return 0;
      }
      if (0x32 < (long)local_30) {
        local_30 = (void *)0x32;
      }
      memset(indent_string,0x2e,(size_t)local_30);
      indent_string[(long)local_30] = '\0';
    }
  }
  else {
    *indent_string = '\0';
  }
  return 1;
}

Assistant:

static BOOL DBG_get_indent(DBG_LEVEL_ID level, const char *format,
                           char *indent_string)
{
    int ret;

    /* determine whether to output an ENTRY line */
    if(DLI_ENTRY == level||DLI_EXIT == level)
    {
        if(0 != max_entry_level)
        {
            INT_PTR nesting;

            /* Determine if this is an entry or an
               exit */
            if(DLI_EXIT == level)
            {
                nesting = (INT_PTR) pthread_getspecific(entry_level_key);
                /* avoid going negative */
                if(nesting != 0)
                {
                    nesting--;
                    if ((ret = pthread_setspecific(entry_level_key,
                                                     (LPVOID)nesting)) != 0)
                    {
                        fprintf(stderr, "ERROR : pthread_setspecific() failed "
                                "error:%d (%s)\n", ret, strerror(ret));
                    }
                }
            }
            else
            {
                nesting = (INT_PTR) pthread_getspecific(entry_level_key);

                if ((ret = pthread_setspecific(entry_level_key,
                                                 (LPVOID)(nesting+1))) != 0)
                {
                    fprintf(stderr, "ERROR : pthread_setspecific() failed "
                            "error:%d (%s)\n", ret, strerror(ret));
                }
            }

            /* see if we're past the level treshold */
            if(nesting >= max_entry_level)
            {
                return FALSE;
            }

            /* generate indentation string */
            if(MAX_NESTING < nesting)
            {
                nesting = MAX_NESTING;
            }
            memset(indent_string,INDENT_CHAR ,nesting);
            indent_string[nesting] = '\0';
        }
        else
        {
            indent_string[0] = '\0';
        }
    }
    else
    {
        indent_string[0] = '\0';
    }
    return TRUE;
}